

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_send(nghttp2_session *session)

{
  uint8_t **ppuVar1;
  size_t sVar2;
  ssize_t sVar3;
  uint8_t *data;
  uint8_t *local_20;
  
  local_20 = (uint8_t *)0x0;
  while( true ) {
    sVar2 = nghttp2_session_mem_send_internal(session,&local_20,0);
    if ((long)sVar2 < 1) {
      return (int)sVar2;
    }
    sVar3 = (*(session->callbacks).send_callback)(session,local_20,sVar2,0,session->user_data);
    if (sVar3 < 0) break;
    ppuVar1 = &(((session->aob).framebufs.cur)->buf).pos;
    *ppuVar1 = *ppuVar1 + (sVar3 - sVar2);
  }
  if (sVar3 != -0x1f8) {
    return -0x386;
  }
  ppuVar1 = &(((session->aob).framebufs.cur)->buf).pos;
  *ppuVar1 = *ppuVar1 + -sVar2;
  return 0;
}

Assistant:

int nghttp2_session_send(nghttp2_session *session) {
  const uint8_t *data = NULL;
  ssize_t datalen;
  ssize_t sentlen;
  nghttp2_bufs *framebufs;

  framebufs = &session->aob.framebufs;

  for (;;) {
    datalen = nghttp2_session_mem_send_internal(session, &data, 0);
    if (datalen <= 0) {
      return (int)datalen;
    }
    sentlen = session->callbacks.send_callback(session, data, (size_t)datalen,
                                               0, session->user_data);
    if (sentlen < 0) {
      if (sentlen == NGHTTP2_ERR_WOULDBLOCK) {
        /* Transmission canceled. Rewind the offset */
        framebufs->cur->buf.pos -= datalen;

        return 0;
      }
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    /* Rewind the offset to the amount of unsent bytes */
    framebufs->cur->buf.pos -= datalen - sentlen;
  }
}